

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderRenderingPointsCase::~GeometryShaderRenderingPointsCase
          (GeometryShaderRenderingPointsCase *this)

{
  GeometryShaderRenderingPointsCase *this_local;
  
  ~GeometryShaderRenderingPointsCase(this);
  operator_delete(this,800);
  return;
}

Assistant:

GeometryShaderRenderingPointsCase::~GeometryShaderRenderingPointsCase()
{
	if (m_raw_array_data != NULL)
	{
		delete[] m_raw_array_data;

		m_raw_array_data = NULL;
	}

	if (m_unordered_array_data != NULL)
	{
		delete[] m_unordered_array_data;

		m_unordered_array_data = NULL;
	}

	if (m_unordered_elements_data != NULL)
	{
		delete[] m_unordered_elements_data;

		m_unordered_elements_data = NULL;
	}
}